

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void google::protobuf::internal::ExtensionSet::
     ForEachPrefetchImpl<google::protobuf::internal::ExtensionSet::KeyValue_const*,google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
               (KeyValue *it,KeyValue *end,size_t *func)

{
  void *pvVar1;
  int local_3c;
  KeyValue *pKStack_38;
  int i;
  KeyValue *prefetch;
  int kPrefetchDistance;
  KeyValue *end_local;
  KeyValue *it_local;
  anon_class_8_1_736c71da local_10;
  anon_class_8_1_736c71da func_local;
  
  local_3c = 0;
  local_10.total_size = func;
  for (pKStack_38 = it; end_local = it, pKStack_38 != end && local_3c < 0x10;
      pKStack_38 = pKStack_38 + 1) {
    pvVar1 = Extension::PrefetchPtr(&pKStack_38->second);
    Prefetch::operator()((Prefetch *)((long)&it_local + 7),pvVar1);
    local_3c = local_3c + 1;
  }
  for (; pKStack_38 != end; pKStack_38 = pKStack_38 + 1) {
    MessageSetByteSize::anon_class_8_1_736c71da::operator()
              (&local_10,end_local->first,&end_local->second);
    pvVar1 = Extension::PrefetchPtr(&pKStack_38->second);
    Prefetch::operator()((Prefetch *)((long)&it_local + 7),pvVar1);
    end_local = end_local + 1;
  }
  for (; end_local != end; end_local = end_local + 1) {
    MessageSetByteSize::anon_class_8_1_736c71da::operator()
              (&local_10,end_local->first,&end_local->second);
  }
  return;
}

Assistant:

static void ForEachPrefetchImpl(Iterator it, Iterator end,
                                  KeyValueFunctor func,
                                  PrefetchFunctor prefetch_func) {
    // Note: based on arena's ChunkList::Cleanup().
    // Prefetch distance 16 performs better than 8 in load tests.
    constexpr int kPrefetchDistance = 16;
    Iterator prefetch = it;
    // Prefetch the first kPrefetchDistance extensions.
    for (int i = 0; prefetch != end && i < kPrefetchDistance; ++prefetch, ++i) {
      prefetch_func(prefetch->second.PrefetchPtr());
    }
    // For the middle extensions, call func and then prefetch the extension
    // kPrefetchDistance after the current one.
    for (; prefetch != end; ++it, ++prefetch) {
      func(it->first, it->second);
      prefetch_func(prefetch->second.PrefetchPtr());
    }
    // Call func on the rest without prefetching.
    for (; it != end; ++it) func(it->first, it->second);
  }